

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_or.h
# Opt level: O3

void __thiscall
draco::StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::~StatusOr
          (StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *this)

{
  Mesh *pMVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  pMVar1 = (this->value_)._M_t.super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>
           ._M_t.super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
           super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl;
  if (pMVar1 != (Mesh *)0x0) {
    (**(code **)((long)(pMVar1->super_PointCloud)._vptr_PointCloud + 8))();
  }
  (this->value_)._M_t.super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
  super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
  super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl = (Mesh *)0x0;
  pcVar2 = (this->status_).error_msg_._M_dataplus._M_p;
  paVar3 = &(this->status_).error_msg_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

StatusOr() {}